

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

void WebPDemuxDelete(WebPDemuxer *dmux)

{
  long in_RDI;
  Chunk *cur_chunk;
  Frame *cur_frame;
  Frame *f;
  Chunk *c;
  undefined8 local_18;
  undefined8 local_10;
  
  if (in_RDI != 0) {
    local_18 = *(long *)(in_RDI + 0x48);
    while (local_18 != 0) {
      local_18 = *(long *)(local_18 + 0x48);
      WebPSafeFree((void *)0x10709b);
    }
    local_10 = *(long *)(in_RDI + 0x58);
    while (local_10 != 0) {
      local_10 = *(long *)(local_10 + 0x10);
      WebPSafeFree((void *)0x1070d3);
    }
    WebPSafeFree((void *)0x1070df);
  }
  return;
}

Assistant:

void WebPDemuxDelete(WebPDemuxer* dmux) {
  Chunk* c;
  Frame* f;
  if (dmux == NULL) return;

  for (f = dmux->frames; f != NULL;) {
    Frame* const cur_frame = f;
    f = f->next;
    WebPSafeFree(cur_frame);
  }
  for (c = dmux->chunks; c != NULL;) {
    Chunk* const cur_chunk = c;
    c = c->next;
    WebPSafeFree(cur_chunk);
  }
  WebPSafeFree(dmux);
}